

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-hash.c
# Opt level: O2

void Curl_uint_hash_visit(uint_hash *h,Curl_uint_hash_visit_cb *cb,void *user_data)

{
  _Bool _Var1;
  size_t i;
  ulong uVar2;
  uint_hash_entry *puVar3;
  
  if (((h != (uint_hash *)0x0) && (cb != (Curl_uint_hash_visit_cb *)0x0)) &&
     (h->table != (uint_hash_entry **)0x0)) {
    for (uVar2 = 0; uVar2 < h->slots; uVar2 = uVar2 + 1) {
      puVar3 = (uint_hash_entry *)(h->table + uVar2);
      while (puVar3 = puVar3->next, puVar3 != (uint_hash_entry *)0x0) {
        _Var1 = (*cb)(puVar3->id,puVar3->value,user_data);
        if (!_Var1) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void Curl_uint_hash_visit(struct uint_hash *h,
                          Curl_uint_hash_visit_cb *cb,
                          void *user_data)
{
  if(h && h->table && cb) {
    struct uint_hash_entry *he;
    size_t i;
    DEBUGASSERT(h->init == CURL_UINTHASHINIT);
    for(i = 0; i < h->slots; ++i) {
      for(he = h->table[i]; he; he = he->next) {
        if(!cb(he->id, he->value, user_data))
          return;
      }
    }
  }
}